

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O3

double chicdf(double x,int df)

{
  char *__format;
  double dVar1;
  
  if (df < 1) {
    __format = "Degree of freedom is a real positive integer";
  }
  else {
    if (0.0 <= x) {
      dVar1 = pgamma(x * 0.5,(double)df * 0.5);
      return dVar1;
    }
    __format = "The range of distribution only takes non-negative and real values";
  }
  printf(__format);
  exit(1);
}

Assistant:

double chicdf(double x, int df) {
	double oup,a;
	if (df <= 0 ) {
		printf("Degree of freedom is a real positive integer");
		exit(1);
	}
	
	if (x < 0.) {
		printf("The range of distribution only takes non-negative and real values");
		exit(1);
	}
	a = (double) df;
	oup = pgamma(x/2,a/2);
	return oup;
}